

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

void testrand256(uchar *b32)

{
  uint64_t uVar1;
  long lVar2;
  
  for (lVar2 = 0; (int)lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar1 = testrand64();
    *(uint64_t *)(b32 + lVar2 * 8) = uVar1;
  }
  return;
}

Assistant:

static void testrand256(unsigned char *b32) {
    int i;
    for (i = 0; i < 4; ++i) {
        uint64_t val = testrand64();
        b32[0] = val;
        b32[1] = val >> 8;
        b32[2] = val >> 16;
        b32[3] = val >> 24;
        b32[4] = val >> 32;
        b32[5] = val >> 40;
        b32[6] = val >> 48;
        b32[7] = val >> 56;
        b32 += 8;
    }
}